

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clCreateSubDevices(cl_device_id in_device,cl_device_partition_property *properties,
                         cl_uint num_devices,cl_device_id *out_devices,cl_uint *num_devices_ret)

{
  bool bVar1;
  uint64_t enqueueCounter;
  CLIntercept *this;
  cl_int errorCode;
  time_point end;
  ulong uVar2;
  time_point local_b0;
  cl_device_id in_device_local;
  string local_a0;
  uint64_t local_80;
  cl_uint local_num_devices_ret;
  string propsStr;
  string deviceInfo;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x21;
  }
  if ((g_pIntercept->m_Dispatch).clCreateSubDevices == (cl_api_clCreateSubDevices)0x0) {
    return -0x21;
  }
  enqueueCounter = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if (num_devices_ret == (cl_uint *)0x0) {
    num_devices_ret = &local_num_devices_ret;
  }
  local_num_devices_ret = 0;
  deviceInfo._M_dataplus._M_p = (pointer)&deviceInfo.field_2;
  deviceInfo._M_string_length = 0;
  deviceInfo.field_2._M_local_buf[0] = '\0';
  propsStr._M_dataplus._M_p = (pointer)&propsStr.field_2;
  propsStr._M_string_length = 0;
  propsStr.field_2._M_local_buf[0] = '\0';
  in_device_local = in_device;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    CLIntercept::getDeviceInfoString(g_pIntercept,1,&in_device_local,&deviceInfo);
    CLIntercept::getDevicePartitionPropertiesString(this,properties,&propsStr);
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clCreateSubDevices",enqueueCounter,(cl_kernel)0x0,
               "in_device = %s, properties = [ %s ], num_devices = %u",deviceInfo._M_dataplus._M_p,
               propsStr._M_dataplus._M_p,(ulong)num_devices);
  }
  local_80 = enqueueCounter;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_b0.__d.__r = (duration)0;
  }
  else {
    local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clCreateSubDevices)
                        (in_device_local,properties,num_devices,out_devices,num_devices_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_80 &&
        (local_80 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
      CLIntercept::updateHostTimingStats(this,"clCreateSubDevices",&local_a0,local_b0,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
  }
  bVar1 = (this->m_Config).ErrorLogging;
  if ((bVar1 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00108d7a;
  }
  else if (errorCode == 0) {
    errorCode = 0;
    goto LAB_00108d7a;
  }
  if (bVar1 != false) {
    CLIntercept::logError(this,"clCreateSubDevices",errorCode);
  }
  if ((this->m_Config).ErrorAssert == true) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00108d7a:
  if (((out_devices != (cl_device_id *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*num_devices_ret != 0)) {
    uVar2 = 0;
    do {
      if (((this->m_Config).LeakChecking == true) && (out_devices[uVar2] != (cl_device_id)0x0)) {
        LOCK();
        (this->m_ObjectTracker).m_Devices.NumAllocations.super___atomic_base<unsigned_long>._M_i =
             (this->m_ObjectTracker).m_Devices.NumAllocations.super___atomic_base<unsigned_long>.
             _M_i + 1;
        UNLOCK();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *num_devices_ret);
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateSubDevices",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    CLIntercept::chromeCallLoggingExit(this,"clCreateSubDevices",&local_a0,false,0,local_b0,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  if ((out_devices != (cl_device_id *)0x0) && (errorCode == 0)) {
    CLIntercept::addSubDeviceInfo(this,in_device_local,out_devices,*num_devices_ret);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propsStr._M_dataplus._M_p != &propsStr.field_2) {
    operator_delete(propsStr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deviceInfo._M_dataplus._M_p != &deviceInfo.field_2) {
    operator_delete(deviceInfo._M_dataplus._M_p);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clCreateSubDevices)(
    cl_device_id in_device,
    const cl_device_partition_property* properties,
    cl_uint num_devices,
    cl_device_id* out_devices,
    cl_uint* num_devices_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateSubDevices )
    {
        GET_ENQUEUE_COUNTER();

        cl_uint local_num_devices_ret = 0;
        if( num_devices_ret == NULL )
        {
            num_devices_ret = &local_num_devices_ret;
        }

        std::string deviceInfo;
        std::string propsStr;
        if( pIntercept->config().CallLogging )
        {
            pIntercept->getDeviceInfoString(
                1,
                &in_device,
                deviceInfo );
            pIntercept->getDevicePartitionPropertiesString(
                properties,
                propsStr );
        }
        CALL_LOGGING_ENTER( "in_device = %s, properties = [ %s ], num_devices = %u",
            deviceInfo.c_str(),
            propsStr.c_str(),
            num_devices );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clCreateSubDevices(
            in_device,
            properties,
            num_devices,
            out_devices,
            num_devices_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        if( pIntercept->config().LeakChecking &&
            out_devices &&
            num_devices_ret )
        {
            for( cl_uint d = 0; d < num_devices_ret[0]; d++ )
            {
                ADD_OBJECT_ALLOCATION( out_devices[d] );
            }
        }
        CALL_LOGGING_EXIT( retVal );

        if( retVal == CL_SUCCESS &&
            out_devices &&
            num_devices_ret )
        {
            pIntercept->addSubDeviceInfo(
                in_device,
                out_devices,
                num_devices_ret[0] );
        }

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_DEVICE);
}